

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

int worker_wait_idle(worker_handle *wh)

{
  void *pvVar1;
  int local_1c;
  int ret;
  worker_priv *priv;
  worker_handle *wh_local;
  
  pvVar1 = wh->priv;
  local_1c = 0;
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x10));
  do {
    if (4 < *(uint *)((long)pvVar1 + 0x38)) {
LAB_0010a5ef:
      mutex_unlock((mutex_handle *)((long)pvVar1 + 0x10));
      return local_1c;
    }
    if (*(uint *)((long)pvVar1 + 0x38) < 3) {
      local_1c = -0x16;
      goto LAB_0010a5ef;
    }
    condvar_wait((condvar_handle *)((long)pvVar1 + 8),(mutex_handle *)((long)pvVar1 + 0x10));
  } while( true );
}

Assistant:

int worker_wait_idle(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = 0;

	mutex_lock(&priv->mutex);

	while (priv->state < WORKER_IDLE) {
		if (priv->state < WORKER_BUSY) {
			ret = -EINVAL;
			break;
		}

		condvar_wait(&priv->condvar_idle, &priv->mutex);
	}

	mutex_unlock(&priv->mutex);

	return ret;
}